

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFailure.cpp
# Opt level: O3

void __thiscall
CheckEqualFailure::CheckEqualFailure
          (CheckEqualFailure *this,UtestShell *test,char *fileName,size_t lineNumber,
          SimpleString *expected,SimpleString *actual,SimpleString *text)

{
  SimpleString *this_00;
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  SimpleString *rhs;
  long lVar4;
  
  TestFailure::TestFailure(&this->super_TestFailure,test,fileName,lineNumber);
  (this->super_TestFailure)._vptr_TestFailure = (_func_int **)&PTR__TestFailure_001648d0;
  TestFailure::createUserText((TestFailure *)&stack0xffffffffffffffc0,(SimpleString *)test);
  this_00 = &(this->super_TestFailure).message_;
  SimpleString::operator=(this_00,(SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  lVar4 = 0;
  while( true ) {
    pcVar2 = SimpleString::asCharString(actual);
    cVar1 = pcVar2[lVar4];
    pcVar2 = SimpleString::asCharString(expected);
    if (cVar1 != pcVar2[lVar4]) break;
    lVar4 = lVar4 + 1;
  }
  pcVar2 = SimpleString::asCharString(expected);
  pcVar3 = SimpleString::asCharString(actual);
  StringFromFormat(&stack0xffffffffffffffc0,"expected <%s>\n\tbut was  <%s>",pcVar2,pcVar3);
  rhs = (SimpleString *)&stack0xffffffffffffffc0;
  SimpleString::operator+=(this_00,rhs);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  TestFailure::createDifferenceAtPosString
            ((TestFailure *)&stack0xffffffffffffffc0,rhs,(size_t)actual,(DifferenceFormat)lVar4);
  SimpleString::operator+=(this_00,(SimpleString *)&stack0xffffffffffffffc0);
  SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffc0);
  return;
}

Assistant:

CheckEqualFailure::CheckEqualFailure(UtestShell* test, const char* fileName, size_t lineNumber, const SimpleString& expected, const SimpleString& actual, const SimpleString& text)
: TestFailure(test, fileName, lineNumber)
{
    message_ = createUserText(text);

    size_t failStart;
    for (failStart = 0; actual.asCharString()[failStart] == expected.asCharString()[failStart]; failStart++)
        ;
    message_ += createButWasString(expected, actual);
    message_ += createDifferenceAtPosString(actual, failStart);

}